

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_manager_impl.c
# Opt level: O0

vector loader_manager_impl_script_paths_initialize(void)

{
  int iVar1;
  vector pvVar2;
  long *plVar3;
  size_t __size;
  void *pvVar4;
  size_t size;
  char **script_path_ptr;
  size_t last;
  size_t iterator;
  vector script_paths;
  size_t script_path_size;
  char *script_path;
  portability_working_path_length cwd_path_str_length;
  portability_working_path_str cwd_path_str;
  long local_1038;
  ulong local_1030;
  ulong local_1020;
  long local_1018;
  long local_1010;
  undefined1 local_1008 [4096];
  vector local_8;
  
  memset(local_1008,0,0x1000);
  local_1010 = 0;
  local_1018 = 0;
  local_1020 = 0;
  pvVar2 = (vector)vector_create(8);
  if (pvVar2 == (vector)0x0) {
    local_8 = (vector)0x0;
  }
  else {
    iVar1 = portability_working_path(local_1008,&local_1010);
    if (iVar1 == 0) {
      local_1018 = environment_variable_path_create
                             ("LOADER_SCRIPT_PATH",local_1008,local_1010 + 1,&local_1020);
    }
    else {
      local_1018 = environment_variable_path_create("LOADER_SCRIPT_PATH",".",2,&local_1020);
    }
    log_write_impl_va("metacall",0x50,"loader_manager_impl_script_paths_initialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                      ,0,"Loader script path: %s",local_1018);
    local_1038 = 0;
    for (local_1030 = 0; local_1030 < local_1020; local_1030 = local_1030 + 1) {
      if ((*(char *)(local_1018 + local_1030) == ':') ||
         (*(char *)(local_1018 + local_1030) == '\0')) {
        *(undefined1 *)(local_1018 + local_1030) = 0;
        vector_push_back_empty(pvVar2);
        plVar3 = (long *)vector_back(pvVar2);
        __size = (local_1030 - local_1038) + 1;
        pvVar4 = malloc(__size);
        *plVar3 = (long)pvVar4;
        if (*plVar3 == 0) {
          log_write_impl_va("metacall",0x62,"loader_manager_impl_script_paths_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                            ,0,"Loader script path failed to allocate: %s",local_1018 + local_1038);
        }
        else {
          portability_path_canonical(local_1018 + local_1038,__size,*plVar3,__size);
        }
        local_1038 = local_1030 + 1;
      }
    }
    environment_variable_path_destroy(local_1018);
    local_8 = pvVar2;
  }
  return local_8;
}

Assistant:

vector loader_manager_impl_script_paths_initialize(void)
{
	portability_working_path_str cwd_path_str = { 0 };
	portability_working_path_length cwd_path_str_length = 0;
	char *script_path = NULL;
	size_t script_path_size = 0;
	vector script_paths = vector_create_type(char *);

	if (script_paths == NULL)
	{
		return NULL;
	}

	if (portability_working_path(cwd_path_str, &cwd_path_str_length) == 0)
	{
		script_path = environment_variable_path_create(LOADER_SCRIPT_PATH, cwd_path_str, cwd_path_str_length + 1, &script_path_size);
	}
	else
	{
		script_path = environment_variable_path_create(LOADER_SCRIPT_PATH, LOADER_SCRIPT_DEFAULT_PATH, sizeof(LOADER_SCRIPT_DEFAULT_PATH), &script_path_size);
	}

#if defined(WIN32) || defined(_WIN32)
	/* Normalize the path in place */
	(void)portability_path_separator_normalize_inplace(script_path, script_path_size);
#endif

	log_write("metacall", LOG_LEVEL_DEBUG, "Loader script path: %s", script_path);

	/* Split multiple paths */
	size_t iterator, last = 0;

	for (iterator = 0; iterator < script_path_size; ++iterator)
	{
		if (script_path[iterator] == PORTABILITY_PATH_DELIMITER || script_path[iterator] == '\0')
		{
			script_path[iterator] = '\0';
			vector_push_back_empty(script_paths);
			char **script_path_ptr = vector_back(script_paths);
			size_t size = iterator - last + 1;

			*script_path_ptr = malloc(sizeof(char) * size);

			if (*script_path_ptr == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Loader script path failed to allocate: %s", &script_path[last]);
			}
			else
			{
				portability_path_canonical(&script_path[last], size, *script_path_ptr, size);
			}

			last = iterator + 1;
		}
	}

	environment_variable_path_destroy(script_path);

	return script_paths;
}